

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O2

void __thiscall
tchecker::
make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
::take_reference(make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                 *this)

{
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
  *pmVar1;
  overflow_error *this_00;
  
  pmVar1 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
            *)((long)&((this[-1].
                        super_node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
                        .
                        super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                        .
                        super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
                        ._head._t)->
                      super_edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
                      ).super_edge_t.super_edge_t._t._t + 1);
  this[-1].super_node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>.
  super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  .
  super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>_>_>
  ._head._t = pmVar1;
  if (pmVar1 != (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                 *)0xfffffffffffffffe) {
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"reference counter overflow");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

inline void take_reference(void) const
  {
    refcount_t * refcount = refcount_addr();
    *refcount += 1;
    if (*refcount == REFCOUNT_MAX) // overflow
      throw std::overflow_error("reference counter overflow");
  }